

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  float repeat_rate;
  float repeat_delay;
  float local_28;
  float local_24;
  
  pIVar4 = GetKeyData(key);
  if ((pIVar4->Down == true) && (fVar1 = pIVar4->DownDuration, 0.0 <= fVar1)) {
    if (((flags & 1U) == 0) || ((fVar1 == 0.0 && (!NAN(fVar1))))) {
      if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_001cc0f3;
    }
    else {
      GetTypematicRepeatRate(flags,&local_24,&local_28);
      if ((local_24 < fVar1) && (iVar3 = GetKeyPressedAmount(key,local_24,local_28), 0 < iVar3)) {
LAB_001cc0f3:
        bVar2 = TestKeyOwner(key,owner_id);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!

    bool pressed = (t == 0.0f);
    if (!pressed && ((flags & ImGuiInputFlags_Repeat) != 0))
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}